

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

upb_test_FakeMessageSet_Item_UnknownGroup *
upb_test_FakeMessageSet_Item_unknowngroup(upb_test_FakeMessageSet_Item *msg)

{
  upb_test_FakeMessageSet_Item *to;
  upb_MiniTableField *f;
  bool bVar1;
  void *from;
  undefined1 local_4c [8];
  upb_MiniTableField field;
  upb_test_FakeMessageSet_Item_UnknownGroup *ret;
  upb_test_FakeMessageSet_Item_UnknownGroup *default_val;
  upb_test_FakeMessageSet_Item *msg_local;
  upb_test_FakeMessageSet_Item_UnknownGroup **local_20;
  upb_MiniTableField *local_18;
  upb_test_FakeMessageSet_Item_UnknownGroup *local_10;
  
  ret = (upb_test_FakeMessageSet_Item_UnknownGroup *)0x0;
  local_4c._0_4_ = 8;
  local_4c._4_2_ = 0x40;
  local_4c._6_2_ = 0x46;
  field.number_dont_copy_me__upb_internal_use_only = 0xc20a0000;
  default_val = (upb_test_FakeMessageSet_Item_UnknownGroup *)msg;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&upb_0test__FakeMessageSet__Item__UnknownGroup_msg_init);
  local_10 = default_val;
  local_18 = (upb_MiniTableField *)local_4c;
  local_20 = &ret;
  msg_local = (upb_test_FakeMessageSet_Item *)&field.offset_dont_copy_me__upb_internal_use_only;
  bVar1 = upb_MiniTableField_IsExtension(local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  bVar1 = upb_MiniTableField_IsInOneof(local_18);
  if (((bVar1) ||
      (bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(local_18,local_20)
      , !bVar1)) &&
     (bVar1 = upb_Message_HasBaseField(&local_10->base_dont_copy_me__upb_internal_use_only,local_18)
     , !bVar1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(local_18,msg_local,local_20);
    return (upb_test_FakeMessageSet_Item_UnknownGroup *)field._4_8_;
  }
  f = local_18;
  to = msg_local;
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   (&local_10->base_dont_copy_me__upb_internal_use_only,local_18);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,to,from);
  return (upb_test_FakeMessageSet_Item_UnknownGroup *)field._4_8_;
}

Assistant:

UPB_INLINE const upb_test_FakeMessageSet_Item_UnknownGroup* upb_test_FakeMessageSet_Item_unknowngroup(const upb_test_FakeMessageSet_Item* msg) {
  const upb_test_FakeMessageSet_Item_UnknownGroup* default_val = NULL;
  const upb_test_FakeMessageSet_Item_UnknownGroup* ret;
  const upb_MiniTableField field = {8, UPB_SIZE(24, 64), 70, 0, 10, (int)kUpb_FieldMode_Scalar | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__FakeMessageSet__Item__UnknownGroup_msg_init);
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}